

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O3

void h265e_nal_encode(RK_U8 *dst,H265eNal *nal)

{
  RK_U8 *pRVar1;
  RK_U8 RVar2;
  int iVar3;
  RK_U8 *pRVar4;
  long lVar5;
  RK_U8 *pRVar6;
  MppWriteCtx s;
  MppWriteCtx local_60;
  
  pRVar6 = nal->p_payload;
  iVar3 = nal->i_payload;
  pRVar1 = pRVar6 + iVar3;
  dst[0] = '\0';
  dst[1] = '\0';
  dst[2] = '\0';
  dst[3] = '\x01';
  mpp_writer_init(&local_60,dst + 4,10);
  mpp_writer_put_bits(&local_60,0,1);
  mpp_writer_put_bits(&local_60,nal->i_type,6);
  mpp_writer_put_bits(&local_60,0,6);
  mpp_writer_put_bits(&local_60,nal->temporal_id + 1,3);
  if ((long)iVar3 < 1) {
    pRVar4 = dst + 6;
  }
  else {
    RVar2 = *pRVar6;
    pRVar6 = pRVar6 + 1;
    pRVar4 = dst + 7;
    dst[6] = RVar2;
  }
  if (pRVar6 < pRVar1) {
    RVar2 = *pRVar6;
    pRVar6 = pRVar6 + 1;
    *pRVar4 = RVar2;
    pRVar4 = pRVar4 + 1;
  }
  if (pRVar6 < pRVar1) {
    lVar5 = 0;
    do {
      pRVar4[lVar5] = pRVar6[lVar5];
      lVar5 = lVar5 + 1;
    } while ((long)pRVar1 - (long)pRVar6 != lVar5);
    pRVar4 = pRVar4 + lVar5;
  }
  nal->i_payload = (int)pRVar4 - (int)dst;
  nal->p_payload = dst;
  return;
}

Assistant:

static void h265e_nal_encode(RK_U8 *dst, H265eNal *nal)
{
    RK_S32 b_annexb = 1;
    RK_S32 size = 0;
    RK_U8 *src = nal->p_payload;
    RK_U8 *end = nal->p_payload + nal->i_payload;
    RK_U8 *orig_dst = dst;
    MppWriteCtx s;

    if (b_annexb) {
        *dst++ = 0x00;
        *dst++ = 0x00;
        *dst++ = 0x00;
        *dst++ = 0x01;
    } else /* save room for size later */
        dst += 4;

    /* nal header */
    mpp_writer_init(&s, dst, 10);
    mpp_writer_put_bits(&s, 0, 1); //forbidden_zero_bit
    mpp_writer_put_bits(&s, nal->i_type, 6);//nal_unit_type
    mpp_writer_put_bits(&s, 0, 6); //nuh_reserved_zero_6bits
    mpp_writer_put_bits(&s, nal->temporal_id + 1, 3); //nuh_temporal_id_plus1
    dst += 2;
    dst = h265e_nal_escape_c(dst, src, end);
    size = (RK_S32)((dst - orig_dst) - 4);

    /* Write the size header for mp4/etc */
    if (!b_annexb) {
        /* Size doesn't include the size of the header we're writing now. */
        orig_dst[0] = size >> 24;
        orig_dst[1] = size >> 16;
        orig_dst[2] = size >> 8;
        orig_dst[3] = size >> 0;
    }

    nal->i_payload = size + 4;
    nal->p_payload = orig_dst;
}